

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring_bitmap_lazy_xor_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  byte type1;
  ushort key;
  byte type2_00;
  int iVar1;
  shared_container_t *c;
  container_t *c_00;
  ushort *puVar2;
  uint8_t uVar3;
  bitset_container_t *src_2;
  long lVar4;
  shared_container_t *psVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint16_t uVar10;
  bitset_container_t *bc;
  shared_container_t *psVar11;
  uint uVar12;
  ulong uVar13;
  uint8_t result_type;
  uint8_t type2;
  uint8_t local_56;
  byte local_55;
  uint local_54;
  roaring_array_t *local_50;
  ulong local_48;
  bitset_container_t *local_40;
  ulong local_38;
  
  local_56 = '\0';
  local_54 = (x2->high_low_container).size;
  if (local_54 == 0) {
    return;
  }
  uVar12 = (x1->high_low_container).size;
  uVar7 = (ulong)uVar12;
  if (uVar12 == 0) {
    (x1->high_low_container).flags =
         (x1->high_low_container).flags & 0xfe | (x2->high_low_container).flags & 1;
    ra_overwrite(&x2->high_low_container,&x1->high_low_container,
                 (_Bool)((x2->high_low_container).flags & 1));
    return;
  }
  uVar10 = *(x1->high_low_container).keys;
  puVar2 = (x2->high_low_container).keys;
  uVar9 = 0;
  uVar13 = 0;
  local_50 = &x2->high_low_container;
LAB_00106163:
  do {
    uVar12 = (uint)uVar13;
    key = *puVar2;
    uVar9 = (ulong)(int)uVar9;
    uVar6 = (int)uVar7 - 1;
    while( true ) {
      uVar8 = (uint)uVar9;
      if (uVar10 == key) break;
      if (key <= uVar10) {
        local_55 = local_50->typecodes[uVar13 & 0xffff];
        c_00 = get_copy_of_container
                         (local_50->containers[uVar13 & 0xffff],&local_55,
                          (_Bool)(local_50->flags & 1));
        if ((local_50->flags & 1) != 0) {
          local_50->containers[(int)uVar12] = c_00;
          local_50->typecodes[(int)uVar12] = local_55;
        }
        ra_insert_new_key_value_at(&x1->high_low_container,uVar8,key,c_00,local_55);
        uVar7 = (ulong)((int)uVar7 + 1);
        uVar12 = uVar12 + 1;
        uVar13 = (ulong)uVar12;
        if (uVar12 != local_54) {
          uVar9 = uVar9 + 1;
          puVar2 = (ushort *)((ulong)((uVar12 & 0xffff) * 2) + (long)local_50->keys);
          goto LAB_00106163;
        }
        uVar8 = uVar8 + 1;
        uVar12 = local_54;
        goto LAB_001063f9;
      }
      if (uVar6 == uVar8) goto LAB_001063fe;
      uVar9 = uVar9 + 1;
      uVar10 = (x1->high_low_container).keys[uVar9 & 0xffff];
    }
    type1 = (x1->high_low_container).typecodes[uVar9 & 0xffff];
    psVar5 = (shared_container_t *)(x1->high_low_container).containers[uVar9 & 0xffff];
    local_55 = local_50->typecodes[uVar13 & 0xffff];
    src_2 = (bitset_container_t *)local_50->containers[uVar13 & 0xffff];
    local_38 = uVar7;
    if (type1 == 4) {
      c = (shared_container_t *)container_lazy_xor(psVar5,'\x04',src_2,local_55,&local_56);
      shared_container_free(psVar5);
LAB_001062f1:
      psVar11 = c;
      uVar3 = local_56;
      if (local_56 == '\x04') {
        uVar3 = c->typecode;
        psVar11 = (shared_container_t *)c->container;
      }
      iVar1 = *(int *)&psVar11->container;
      psVar5 = c;
      if ((uVar3 != '\x03') && (uVar3 != '\x02')) goto LAB_00106325;
      if (iVar1 < 1) goto LAB_0010634e;
LAB_00106371:
      (x1->high_low_container).containers[uVar9] = psVar5;
      (x1->high_low_container).typecodes[uVar9] = local_56;
      uVar9 = (ulong)(uVar8 + 1);
      uVar7 = local_38;
    }
    else {
      type2_00 = local_55;
      if (local_55 == 4) {
        type2_00 = *(byte *)&src_2->words;
        src_2 = *(bitset_container_t **)src_2;
      }
      if ((uint)type2_00 + (uint)type1 * 4 != 5) {
        if ((type1 == 1) && (*(int *)&psVar5->container == -1)) {
          local_48 = (ulong)type2_00;
          local_40 = src_2;
          iVar1 = bitset_container_compute_cardinality((bitset_container_t *)psVar5);
          type2_00 = (byte)local_48;
          *(int *)&psVar5->container = iVar1;
          src_2 = local_40;
        }
        c = (shared_container_t *)container_ixor(psVar5,type1,src_2,type2_00,&local_56);
        goto LAB_001062f1;
      }
      bitset_container_xor_nocard((bitset_container_t *)psVar5,src_2,(bitset_container_t *)psVar5);
      local_56 = '\x01';
      iVar1 = *(int *)&psVar5->container;
      psVar11 = psVar5;
LAB_00106325:
      c = psVar5;
      if (iVar1 != 0) {
        if (iVar1 != -1) goto LAB_00106371;
        lVar4 = 0;
        do {
          if (*(long *)(*(long *)&psVar11->typecode + lVar4 * 8) != 0) goto LAB_00106371;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x400);
      }
LAB_0010634e:
      container_free(c,local_56);
      ra_remove_at_index(&x1->high_low_container,uVar8);
      uVar7 = (ulong)uVar6;
    }
    uVar12 = uVar12 + 1;
    uVar13 = (ulong)uVar12;
    uVar8 = (uint)uVar9;
    if ((uVar8 == (uint)uVar7) || (uVar12 == local_54)) {
LAB_001063f9:
      if (uVar8 != (uint)uVar7) {
        return;
      }
LAB_001063fe:
      ra_append_copy_range
                (&x1->high_low_container,local_50,uVar12,local_54,(_Bool)(local_50->flags & 1));
      return;
    }
    uVar10 = (x1->high_low_container).keys[uVar8 & 0xffff];
    puVar2 = (ushort *)((ulong)((uVar12 & 0xffff) * 2) + (long)local_50->keys);
  } while( true );
}

Assistant:

void roaring_bitmap_lazy_xor_inplace(roaring_bitmap_t *x1,
                                     const roaring_bitmap_t *x2) {
    assert(x1 != x2);
    uint8_t result_type = 0;
    int length1 = x1->high_low_container.size;
    const int length2 = x2->high_low_container.size;

    if (0 == length2) return;

    if (0 == length1) {
        roaring_bitmap_overwrite(x1, x2);
        return;
    }
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);

            // We do the computation "in place" only when c1 is not a shared
            // container. Rationale: using a shared container safely with in
            // place computation would require making a copy and then doing the
            // computation in place which is likely less efficient than avoiding
            // in place entirely and always generating a new container.

            container_t *c;
            if (type1 == SHARED_CONTAINER_TYPE) {
                c = container_lazy_xor(c1, type1, c2, type2, &result_type);
                shared_container_free(CAST_shared(c1));  // release
            } else {
                c = container_lazy_ixor(c1, type1, c2, type2, &result_type);
            }

            if (container_nonzero_cardinality(c, result_type)) {
                ra_set_container_at_index(&x1->high_low_container, pos1, c,
                                          result_type);
                ++pos1;
            } else {
                container_free(c, result_type);
                ra_remove_at_index(&x1->high_low_container, pos1);
                --length1;
            }
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        } else if (s1 < s2) {  // s1 < s2
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            // container_t *c2_clone = container_clone(c2, type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_insert_new_key_value_at(&x1->high_low_container, pos1, s2, c2,
                                       type2);
            pos1++;
            length1++;
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&x1->high_low_container, &x2->high_low_container,
                             pos2, length2, is_cow(x2));
    }
}